

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O3

IterateResult __thiscall
dit::anon_unknown_0::SeedBuilderTest<float>::iterate(SeedBuilderTest<float> *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  char *description;
  bool bVar3;
  SeedBuilder builder;
  SeedBuilder local_19c;
  undefined1 local_198 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::SeedBuilder::SeedBuilder(&local_19c);
  tcu::operator<<(&local_19c,this->m_value);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value: ",7);
  std::ostream::_M_insert<double>((double)this->m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected seed: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got seed: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  bVar3 = local_19c.m_hash != this->m_seed;
  if (bVar3) {
    description = "Got invalid seed";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)bVar3,description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log		= m_testCtx.getLog();
		tcu::SeedBuilder	builder;

		builder << m_value;

		log << TestLog::Message << "Value: " << m_value << TestLog::EndMessage;
		log << TestLog::Message << "Expected seed: " << m_seed << TestLog::EndMessage;
		log << TestLog::Message << "Got seed: " << builder.get() << TestLog::EndMessage;

		if (builder.get() != m_seed)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid seed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}